

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Hop_Obj_t * Hop_Remap(Hop_Man_t *p,Hop_Obj_t *pRoot,uint uSupp,int nVars)

{
  int iVar1;
  uint uVar2;
  Hop_Obj_t *pHVar3;
  undefined8 *puVar4;
  int local_38;
  int local_34;
  int k;
  int i;
  Hop_Obj_t *pObj;
  int nVars_local;
  uint uSupp_local;
  Hop_Obj_t *pRoot_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_ManPiNum(p);
  if (iVar1 < nVars) {
    uVar2 = Hop_ManPiNum(p);
    printf("Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n",
           (ulong)(uint)nVars,(ulong)uVar2);
    p_local = (Hop_Man_t *)0x0;
  }
  else {
    pHVar3 = Hop_Regular(pRoot);
    iVar1 = Hop_ObjIsConst1(pHVar3);
    p_local = (Hop_Man_t *)pRoot;
    if (iVar1 == 0) {
      if (uSupp == 0) {
        pHVar3 = Hop_ManConst0(p);
        iVar1 = Hop_ObjPhaseCompl(pRoot);
        p_local = (Hop_Man_t *)Hop_NotCond(pHVar3,iVar1);
      }
      else {
        local_38 = 0;
        for (local_34 = 0;
            (iVar1 = Vec_PtrSize(p->vPis), local_34 < iVar1 &&
            (puVar4 = (undefined8 *)Vec_PtrEntry(p->vPis,local_34), local_34 != nVars));
            local_34 = local_34 + 1) {
          if ((uSupp & 1 << ((byte)local_34 & 0x1f)) == 0) {
            pHVar3 = Hop_ManConst0(p);
            *puVar4 = pHVar3;
          }
          else {
            pHVar3 = Hop_IthVar(p,local_38);
            *puVar4 = pHVar3;
            local_38 = local_38 + 1;
          }
        }
        if ((local_38 < 1) || (nVars <= local_38)) {
          __assert_fail("k > 0 && k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                        ,0x220,"Hop_Obj_t *Hop_Remap(Hop_Man_t *, Hop_Obj_t *, unsigned int, int)");
        }
        pHVar3 = Hop_Regular(pRoot);
        Hop_Remap_rec(p,pHVar3);
        pHVar3 = Hop_Regular(pRoot);
        Hop_ConeUnmark_rec(pHVar3);
        pHVar3 = Hop_Regular(pRoot);
        pHVar3 = (Hop_Obj_t *)(pHVar3->field_0).pData;
        iVar1 = Hop_IsComplement(pRoot);
        p_local = (Hop_Man_t *)Hop_NotCond(pHVar3,iVar1);
      }
    }
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_Remap( Hop_Man_t * p, Hop_Obj_t * pRoot, unsigned uSupp, int nVars )
{
    Hop_Obj_t * pObj;
    int i, k;
    // quit if the PI variable is not defined
    if ( nVars > Hop_ManPiNum(p) )
    {
        printf( "Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n", nVars, Hop_ManPiNum(p) );
        return NULL;
    }
    // return if constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return pRoot;
    if ( uSupp == 0 )
        return Hop_NotCond( Hop_ManConst0(p), Hop_ObjPhaseCompl(pRoot) );
    // set the PI mapping
    k = 0;
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( i == nVars )
           break;
        if ( uSupp & (1 << i) )
            pObj->pData = Hop_IthVar(p, k++);
        else
            pObj->pData = Hop_ManConst0(p);
    }
    assert( k > 0 && k < nVars );
    // recursively perform composition
    Hop_Remap_rec( p, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}